

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  ulong uVar4;
  Expr *pEVar5;
  Table *pTVar6;
  Mem *pMVar7;
  anon_union_8_4_82a96254_for_uNC aVar8;
  anon_union_8_4_82a96254_for_uNC aVar9;
  undefined1 *puVar10;
  char *pcVar11;
  ushort uVar12;
  long lVar13;
  int idx;
  Select *pSVar14;
  code *xDel;
  ExprList_item *pEVar15;
  long lVar16;
  long in_FS_OFFSET;
  char *zOrigTab;
  char *zOrigDb;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 local_70 [40];
  undefined1 *puStack_48;
  Select *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  aVar8 = (anon_union_8_4_82a96254_for_uNC)local_70._16_8_;
  aVar9 = (anon_union_8_4_82a96254_for_uNC)local_70._32_8_;
  puVar10 = puStack_48;
  if (pParse->colNamesSet == '\0') {
    db = pParse->db;
    pVVar1 = pParse->pVdbe;
    do {
      pSVar14 = pSelect;
      pSelect = pSVar14->pPrior;
    } while (pSVar14->pPrior != (Select *)0x0);
    pEVar2 = pSVar14->pEList;
    pSVar3 = pSVar14->pSrc;
    pParse->colNamesSet = '\x01';
    uVar4 = db->flags;
    sqlite3VdbeSetNumCols(pVVar1,pEVar2->nExpr);
    aVar8 = (anon_union_8_4_82a96254_for_uNC)local_70._16_8_;
    aVar9 = (anon_union_8_4_82a96254_for_uNC)local_70._32_8_;
    puVar10 = puStack_48;
    if (0 < pEVar2->nExpr) {
      pEVar15 = pEVar2->a;
      lVar13 = 0;
      lVar16 = 0;
      do {
        pEVar5 = pEVar15->pExpr;
        pcVar11 = pEVar15->zEName;
        if ((pcVar11 == (char *)0x0) || (((pEVar15->fg).field_0x1 & 3) != 0)) {
          if (((uVar4 & 0x44) == 0) || (pEVar5->op != 0xa8)) {
            if (pcVar11 == (char *)0x0) {
              pcVar11 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar16 + 1));
            }
            else {
              pcVar11 = sqlite3DbStrDup(db,pcVar11);
            }
          }
          else {
            uVar12 = pEVar5->iColumn;
            pTVar6 = (pEVar5->y).pTab;
            if ((short)uVar12 < 0) {
              uVar12 = pTVar6->iPKey;
              pcVar11 = "rowid";
              if (-1 < (short)uVar12) goto LAB_001889ff;
            }
            else {
LAB_001889ff:
              pcVar11 = pTVar6->aCol[uVar12].zCnName;
            }
            if ((uVar4 & 4) == 0) {
              if (pVVar1->db->mallocFailed == '\0') {
                pMVar7 = pVVar1->aColName;
                goto LAB_00188a53;
              }
              goto LAB_00188ac5;
            }
            pcVar11 = sqlite3MPrintf(db,"%s.%s",pTVar6->zName);
          }
          if (pVVar1->db->mallocFailed == '\0') {
            pMVar7 = pVVar1->aColName;
            xDel = sqlite3OomClear;
            goto LAB_00188ac0;
          }
        }
        else if (pVVar1->db->mallocFailed == '\0') {
          pMVar7 = pVVar1->aColName;
LAB_00188a53:
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_00188ac0:
          sqlite3VdbeMemSetStr((Mem *)((long)&pMVar7->u + lVar13),pcVar11,-1,'\x01',xDel);
        }
LAB_00188ac5:
        lVar16 = lVar16 + 1;
        pEVar15 = pEVar15 + 1;
        lVar13 = lVar13 + 0x38;
      } while (lVar16 < pEVar2->nExpr);
      pVVar1 = pParse->pVdbe;
      local_40 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
      local_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_70._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_70._24_8_ = (NameContext *)0x0;
      local_70._0_8_ = pParse;
      local_70._8_8_ = pSVar3;
      aVar8.pEList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
      aVar9.pEList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
      puVar10 = &DAT_aaaaaaaaaaaaaaaa;
      if (0 < pEVar2->nExpr) {
        pEVar15 = pEVar2->a;
        lVar16 = 0;
        lVar13 = 0;
        do {
          local_78 = (char *)0x0;
          local_80 = (char *)0x0;
          local_88 = (char *)0x0;
          pcVar11 = columnTypeImpl((NameContext *)local_70,pEVar15->pExpr,&local_78,&local_80,
                                   &local_88);
          idx = (int)lVar13;
          sqlite3VdbeSetColName(pVVar1,idx,2,local_78,(_func_void_void_ptr *)0xffffffffffffffff);
          sqlite3VdbeSetColName(pVVar1,idx,3,local_80,(_func_void_void_ptr *)0xffffffffffffffff);
          sqlite3VdbeSetColName(pVVar1,idx,4,local_88,(_func_void_void_ptr *)0xffffffffffffffff);
          if (pVVar1->db->mallocFailed == '\0') {
            sqlite3VdbeMemSetStr
                      ((Mem *)((long)&pVVar1->aColName[pVVar1->nResAlloc].u + lVar16),pcVar11,-1,
                       '\x01',(_func_void_void_ptr *)0xffffffffffffffff);
          }
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 0x38;
          pEVar15 = pEVar15 + 1;
          aVar8 = (anon_union_8_4_82a96254_for_uNC)local_70._16_8_;
          aVar9 = (anon_union_8_4_82a96254_for_uNC)local_70._32_8_;
          puVar10 = puStack_48;
        } while (lVar13 < pEVar2->nExpr);
      }
    }
  }
  puStack_48 = puVar10;
  local_70._32_8_ = aVar9;
  local_70._16_8_ = aVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}